

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  ulong uVar2;
  char *Size;
  undefined4 in_register_00000034;
  char *Size_00;
  char *Ptr;
  
  Ptr = (char *)CONCAT44(in_register_00000034,__fd);
  do {
    while( true ) {
      while( true ) {
        pcVar1 = this->OutBufCur;
        Size_00 = this->OutBufEnd + -(long)pcVar1;
        Size = (char *)__buf;
        if (__buf < Size_00 || (char *)((long)__buf + -(long)Size_00) == (char *)0x0)
        goto LAB_00db4998;
        if (this->OutBufStart != (char *)0x0) break;
        uVar2 = write((int)this,Ptr,(size_t)__buf);
        if ((uVar2 & 1) != 0) {
          return (ssize_t)this;
        }
      }
      if (pcVar1 == this->OutBufStart) break;
      copy_to_buffer(this,Ptr,(size_t)Size_00);
      flush_nonempty(this);
      Ptr = Ptr + (long)Size_00;
      __buf = (char *)((long)__buf + -(long)Size_00);
    }
    if (this->OutBufEnd == pcVar1) {
      __assert_fail("NumBytes != 0 && \"undefined behavior\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                    ,0x108,"raw_ostream &llvm::raw_ostream::write(const char *, size_t)");
    }
    Size = (char *)((ulong)__buf % (ulong)Size_00);
    (*this->_vptr_raw_ostream[8])(this,Ptr,(long)__buf - (long)Size);
    Ptr = Ptr + ((long)__buf - (long)Size);
    __buf = Size;
  } while (this->OutBufEnd + -(long)this->OutBufCur < Size);
LAB_00db4998:
  copy_to_buffer(this,Ptr,(size_t)Size);
  return (ssize_t)this;
}

Assistant:

raw_ostream &raw_ostream::write(const char *Ptr, size_t Size) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(size_t(OutBufEnd - OutBufCur) < Size)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == BufferKind::Unbuffered) {
        write_impl(Ptr, Size);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(Ptr, Size);
    }

    size_t NumBytes = OutBufEnd - OutBufCur;

    // If the buffer is empty at this point we have a string that is larger
    // than the buffer. Directly write the chunk that is a multiple of the
    // preferred buffer size and put the remainder in the buffer.
    if (LLVM_UNLIKELY(OutBufCur == OutBufStart)) {
      assert(NumBytes != 0 && "undefined behavior");
      size_t BytesToWrite = Size - (Size % NumBytes);
      write_impl(Ptr, BytesToWrite);
      size_t BytesRemaining = Size - BytesToWrite;
      if (BytesRemaining > size_t(OutBufEnd - OutBufCur)) {
        // Too much left over to copy into our buffer.
        return write(Ptr + BytesToWrite, BytesRemaining);
      }
      copy_to_buffer(Ptr + BytesToWrite, BytesRemaining);
      return *this;
    }

    // We don't have enough space in the buffer to fit the string in. Insert as
    // much as possible, flush and start over with the remainder.
    copy_to_buffer(Ptr, NumBytes);
    flush_nonempty();
    return write(Ptr + NumBytes, Size - NumBytes);
  }

  copy_to_buffer(Ptr, Size);

  return *this;
}